

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O2

void CB_EXPLORE_ADF::predict_or_learn_cover<true>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  vector<float,_std::allocator<float>_> *this;
  label *this_00;
  uint uVar1;
  example *peVar2;
  pointer pfVar3;
  action_score *paVar4;
  uint32_t i_2;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  size_t i_1;
  size_t sVar8;
  uint32_t i;
  float fVar9;
  cb_explore_adf *pcVar10;
  uint32_t j;
  ulong uVar11;
  ulong uVar12;
  polyprediction *preds;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar18;
  undefined1 auVar19 [16];
  float fVar20;
  undefined4 in_XMM2_Db;
  float local_c8;
  float local_b8;
  wclass local_a8;
  float local_98;
  undefined8 local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  v_array<COST_SENSITIVE::label> *local_70;
  v_array<CB::label> *local_68;
  vector<float,_std::allocator<float>_> *local_60;
  multi_ex *local_58;
  score_iterator local_50;
  score_iterator local_40;
  undefined1 auVar17 [16];
  
  if ((data->gen_cs).cb_type == 3) {
    GEN_CS::gen_cs_example_dr<true>(&data->gen_cs,examples,&data->cs_labels);
  }
  else {
    GEN_CS::gen_cs_example<false>(&data->gen_cs,examples,&data->cs_labels);
  }
  fVar9 = 0.0;
  LEARNER::multiline_learn_or_predict<true>(base,examples,data->offset,0);
  peVar2 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar12 = (long)(peVar2->pred).scalars._end - (long)(peVar2->pred).scalars._begin >> 3;
  uVar11 = data->cover_size;
  local_98 = (float)(uVar12 & 0xffffffff);
  lVar5 = (uVar12 & 0xffffffff) * data->counter;
  auVar19._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar19._0_8_ = lVar5;
  auVar19._12_4_ = 0x45300000;
  auVar14._8_8_ = auVar19._8_8_ - 1.9342813113834067e+25;
  preds = &peVar2->pred;
  auVar14._0_8_ =
       SQRT(auVar14._8_8_ + ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0));
  auVar15._4_12_ = auVar14._4_12_;
  auVar15._0_4_ = (float)auVar14._0_8_;
  auVar17._0_8_ = auVar15._0_8_;
  auVar17._8_4_ = (int)((ulong)auVar14._0_8_ >> 0x20);
  auVar17._12_4_ = in_XMM2_Db;
  auVar16._8_8_ = auVar17._8_8_;
  auVar16._4_4_ = local_98;
  auVar16._0_4_ = auVar15._0_4_;
  auVar19 = divps(_DAT_00243370,auVar16);
  uStack_80 = auVar19._4_4_;
  local_88 = CONCAT44(uStack_80,uStack_80);
  pcVar10 = data;
  uStack_7c = uStack_80;
  local_58 = examples;
  v_array<ACTION_SCORE::action_score>::clear(&data->action_probs);
  for (; (float)uVar12 != fVar9; fVar9 = (float)((int)fVar9 + 1)) {
    local_a8.class_index = 0;
    pcVar10 = data;
    local_a8.x = fVar9;
    v_array<ACTION_SCORE::action_score>::push_back(&data->action_probs,(action_score *)&local_a8);
  }
  pfVar3 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar3) {
    (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = pfVar3;
  }
  fVar9 = 1.0 / (float)uVar11;
  local_b8 = auVar19._0_4_;
  if ((float)local_88 <= local_b8) {
    local_b8 = (float)local_88;
  }
  this = &data->scores;
  uVar12 = uVar12 & 0xffffffff;
  for (lVar5 = 0; uVar12 * 8 - lVar5 != 0; lVar5 = lVar5 + 8) {
    pcVar10 = (cb_explore_adf *)this;
    std::vector<float,_std::allocator<float>_>::push_back
              (this,(value_type_conflict3 *)((long)&((preds->a_s)._begin)->score + lVar5));
  }
  if (data->first_only == false) {
    sVar7 = fill_tied(pcVar10,(v_array<ACTION_SCORE::action_score> *)&preds->scalars);
    for (sVar8 = 0; sVar7 != sVar8; sVar8 = sVar8 + 1) {
      uVar1 = (preds->a_s)._begin[sVar8].action;
      paVar4 = (data->action_probs)._begin;
      paVar4[uVar1].score = paVar4[uVar1].score + fVar9 / (float)sVar7;
    }
  }
  else {
    uVar1 = ((preds->a_s)._begin)->action;
    paVar4 = (data->action_probs)._begin;
    paVar4[uVar1].score = paVar4[uVar1].score + fVar9;
  }
  local_98 = local_98 * local_b8;
  local_c8 = (fVar9 - local_b8) + local_98;
  this_00 = &data->cs_labels_2;
  local_68 = &data->cb_labels;
  local_70 = &data->prepped_cs_labels;
  uVar11 = 1;
  local_60 = this;
  while (uVar11 < data->cover_size) {
    local_88 = uVar11;
    v_array<COST_SENSITIVE::wclass>::clear(&this_00->costs);
    lVar5 = 0;
    for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
      fVar13 = (data->action_probs)._begin[uVar11].score;
      fVar18 = local_b8;
      if (local_b8 <= fVar13) {
        fVar18 = fVar13;
      }
      local_a8.x = *(float *)((long)&((data->cs_labels).costs._begin)->x + lVar5) -
                   (data->psi * local_b8) / (fVar18 / local_c8);
      local_a8.class_index = (uint32_t)uVar11;
      local_a8.partial_prediction = 0.0;
      local_a8.wap_value = 0.0;
      v_array<COST_SENSITIVE::wclass>::push_back(&this_00->costs,&local_a8);
      lVar5 = lVar5 + 0x10;
    }
    pcVar10 = (cb_explore_adf *)data->cs_ldf_learner;
    uVar11 = local_88 + 1;
    GEN_CS::call_cs_ldf<true>
              ((multi_learner *)pcVar10,local_58,local_68,this_00,local_70,data->offset,uVar11);
    for (uVar6 = 0; uVar12 != uVar6; uVar6 = uVar6 + 1) {
      pfVar3 = (local_60->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar3[uVar6] = (preds->a_s)._begin[uVar6].score + pfVar3[uVar6];
    }
    if (data->first_only == false) {
      sVar7 = fill_tied(pcVar10,(v_array<ACTION_SCORE::action_score> *)&preds->scalars);
      fVar13 = fVar9 / (float)sVar7;
      for (sVar8 = 0; sVar7 != sVar8; sVar8 = sVar8 + 1) {
        uVar1 = (preds->a_s)._begin[sVar8].action;
        paVar4 = (data->action_probs)._begin;
        fVar18 = paVar4[uVar1].score;
        fVar20 = (fVar18 - local_b8) + fVar13;
        uVar6 = (ulong)fVar20;
        local_c8 = local_c8 +
                   (float)(~-(uint)(fVar18 < local_b8) & (uint)fVar13 |
                          (uint)(float)((long)(fVar20 - 9.223372e+18) & (long)uVar6 >> 0x3f | uVar6)
                          & -(uint)(fVar18 < local_b8));
        paVar4[uVar1].score = fVar13 + fVar18;
      }
    }
    else {
      uVar1 = ((preds->a_s)._begin)->action;
      paVar4 = (data->action_probs)._begin;
      fVar13 = paVar4[uVar1].score;
      fVar18 = (fVar13 - local_b8) + fVar9;
      uVar6 = (ulong)fVar18;
      local_c8 = local_c8 +
                 (float)(~-(uint)(fVar13 < local_b8) & (uint)fVar9 |
                        (uint)(float)((long)(fVar18 - 9.223372e+18) & (long)uVar6 >> 0x3f | uVar6) &
                        -(uint)(fVar13 < local_b8));
      paVar4[uVar1].score = fVar9 + fVar13;
    }
  }
  local_40._p = (data->action_probs)._begin;
  local_40._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_50._p = (data->action_probs)._end;
  local_50._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
            (local_98,(bool)(data->nounif ^ 1),&local_40,&local_50);
  do_sort(data);
  for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
    (preds->a_s)._begin[uVar11] = (data->action_probs)._begin[uVar11];
  }
  data->counter = data->counter + 1;
  return;
}

Assistant:

void predict_or_learn_cover(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Randomize over predictions from a base set of predictors
  // Use cost sensitive oracle to cover actions to form distribution.
  const bool is_mtr = data.gen_cs.cb_type == CB_TYPE_MTR;
  if (is_learn)
  {
    if (is_mtr)  // use DR estimates for non-ERM policies in MTR
      GEN_CS::gen_cs_example_dr<true>(data.gen_cs, examples, data.cs_labels);
    else
      GEN_CS::gen_cs_example<false>(data.gen_cs, examples, data.cs_labels);
    multiline_learn_or_predict<true>(base, examples, data.offset);
  }
  else
  {
    GEN_CS::gen_cs_example_ips(examples, data.cs_labels);
    multiline_learn_or_predict<false>(base, examples, data.offset);
  }

  v_array<action_score>& preds = examples[0]->pred.a_s;
  const uint32_t num_actions = (uint32_t)preds.size();

  float additive_probability = 1.f / (float)data.cover_size;
  const float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(data.counter * num_actions));
  v_array<action_score>& probs = data.action_probs;
  probs.clear();
  for (uint32_t i = 0; i < num_actions; i++) probs.push_back({i, 0.});
  data.scores.clear();
  for (uint32_t i = 0; i < num_actions; i++) data.scores.push_back(preds[i].score);

  if (!data.first_only)
  {
    size_t tied_actions = fill_tied(data, preds);
    for (size_t i = 0; i < tied_actions; ++i) probs[preds[i].action].score += additive_probability / tied_actions;
  }
  else
    probs[preds[0].action].score += additive_probability;

  float norm = min_prob * num_actions + (additive_probability - min_prob);
  for (size_t i = 1; i < data.cover_size; i++)
  {
    // Create costs of each action based on online cover
    if (is_learn)
    {
      data.cs_labels_2.costs.clear();
      for (uint32_t j = 0; j < num_actions; j++)
      {
        float pseudo_cost = data.cs_labels.costs[j].x - data.psi * min_prob / (max(probs[j].score, min_prob) / norm);
        data.cs_labels_2.costs.push_back({pseudo_cost, j, 0., 0.});
      }
      GEN_CS::call_cs_ldf<true>(*(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels_2,
          data.prepped_cs_labels, data.offset, i + 1);
    }
    else
      GEN_CS::call_cs_ldf<false>(
          *(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels, data.prepped_cs_labels, data.offset, i + 1);

    for (uint32_t i = 0; i < num_actions; i++) data.scores[i] += preds[i].score;
    if (!data.first_only)
    {
      size_t tied_actions = fill_tied(data, preds);
      const float add_prob = additive_probability / tied_actions;
      for (size_t i = 0; i < tied_actions; ++i)
      {
        if (probs[preds[i].action].score < min_prob)
          norm += max(0, add_prob - (min_prob - probs[preds[i].action].score));
        else
          norm += add_prob;
        probs[preds[i].action].score += add_prob;
      }
    }
    else
    {
      uint32_t action = preds[0].action;
      if (probs[action].score < min_prob)
        norm += max(0, additive_probability - (min_prob - probs[action].score));
      else
        norm += additive_probability;
      probs[action].score += additive_probability;
    }
  }

  enforce_minimum_probability(min_prob * num_actions, !data.nounif, begin_scores(probs), end_scores(probs));

  do_sort(data);
  for (size_t i = 0; i < num_actions; i++) preds[i] = probs[i];

  ++data.counter;
}